

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O2

XML_Convert_Result latin1_toUtf8(ENCODING *enc,char **fromP,char *fromLim,char **toP,char *toLim)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  
  while( true ) {
    while( true ) {
      pbVar2 = (byte *)*fromP;
      if (pbVar2 == (byte *)fromLim) {
        return XML_CONVERT_COMPLETED;
      }
      bVar1 = *pbVar2;
      pbVar3 = (byte *)*toP;
      if (-1 < (char)bVar1) break;
      if ((long)toLim - (long)pbVar3 < 2) {
        return XML_CONVERT_OUTPUT_EXHAUSTED;
      }
      *toP = (char *)(pbVar3 + 1);
      *pbVar3 = bVar1 >> 6 | 0xc0;
      pbVar2 = (byte *)*toP;
      *toP = (char *)(pbVar2 + 1);
      *pbVar2 = bVar1 & 0xbf;
      *fromP = *fromP + 1;
    }
    if (pbVar3 == (byte *)toLim) break;
    *fromP = (char *)(pbVar2 + 1);
    bVar1 = *pbVar2;
    pbVar2 = (byte *)*toP;
    *toP = (char *)(pbVar2 + 1);
    *pbVar2 = bVar1;
  }
  return XML_CONVERT_OUTPUT_EXHAUSTED;
}

Assistant:

static enum XML_Convert_Result PTRCALL
latin1_toUtf8(const ENCODING *enc, const char **fromP, const char *fromLim,
              char **toP, const char *toLim) {
  UNUSED_P(enc);
  for (;;) {
    unsigned char c;
    if (*fromP == fromLim)
      return XML_CONVERT_COMPLETED;
    c = (unsigned char)**fromP;
    if (c & 0x80) {
      if (toLim - *toP < 2)
        return XML_CONVERT_OUTPUT_EXHAUSTED;
      *(*toP)++ = (char)((c >> 6) | UTF8_cval2);
      *(*toP)++ = (char)((c & 0x3f) | 0x80);
      (*fromP)++;
    } else {
      if (*toP == toLim)
        return XML_CONVERT_OUTPUT_EXHAUSTED;
      *(*toP)++ = *(*fromP)++;
    }
  }
}